

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O3

void mpz_div_q_2exp(__mpz_struct *q,__mpz_struct *u,mp_bitcnt_t bit_index,mpz_div_round_mode mode)

{
  ulong *puVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  mp_ptr pmVar5;
  mp_limb_t *pmVar6;
  byte bVar7;
  long lVar8;
  long size;
  ulong uVar9;
  mp_ptr pmVar10;
  ulong uVar11;
  bool bVar12;
  __mpz_struct local_48;
  
  uVar2 = u->_mp_size;
  if (uVar2 == 0) {
    q->_mp_size = 0;
    return;
  }
  uVar11 = bit_index >> 6;
  uVar4 = -uVar2;
  if (0 < (int)uVar2) {
    uVar4 = uVar2;
  }
  size = uVar4 - uVar11;
  bVar7 = (byte)bit_index & 0x3f;
  bVar12 = true;
  if (0 < (int)uVar2 == mode) {
    if (0 < size) {
      if (0x3f < bit_index) {
        lVar8 = uVar11 + 1;
        do {
          if (u->_mp_d[lVar8 + -2] != 0) {
            bVar12 = false;
            goto LAB_005cfe4d;
          }
          lVar8 = lVar8 + -1;
        } while (1 < lVar8);
      }
      bVar12 = (u->_mp_d[uVar11] & ~(-1L << bVar7)) == 0;
      goto LAB_005cfe4d;
    }
    q->_mp_size = 0;
  }
  else {
LAB_005cfe4d:
    if (size < 1) {
      size = 0;
LAB_005cfeee:
      q->_mp_size = (int)size;
    }
    else {
      if (q->_mp_alloc < size) {
        pmVar5 = mpz_realloc(q,size);
      }
      else {
        pmVar5 = q->_mp_d;
      }
      pmVar6 = u->_mp_d;
      puVar1 = pmVar6 + uVar11;
      if ((bit_index & 0x3f) == 0) {
        lVar8 = 0;
        do {
          pmVar5[lVar8] = puVar1[lVar8];
          lVar8 = lVar8 + 1;
        } while (size != lVar8);
        goto LAB_005cfeee;
      }
      uVar9 = *puVar1 >> bVar7;
      pmVar10 = pmVar5;
      if (size != 1) {
        uVar11 = uVar11 + 1;
        do {
          uVar3 = pmVar6[uVar11];
          *pmVar10 = uVar3 << (0x40 - bVar7 & 0x3f) | uVar9;
          uVar9 = uVar3 >> bVar7;
          pmVar10 = pmVar10 + 1;
          uVar11 = uVar11 + 1;
        } while (uVar4 != uVar11);
      }
      *pmVar10 = uVar9;
      q->_mp_size = (int)size - (uint)(pmVar5[size + -1] == 0);
    }
    if (bVar12) goto LAB_005cff44;
  }
  local_48._mp_size = 1;
  pmVar6 = (mp_limb_t *)(*gmp_allocate_func)(8);
  local_48._mp_alloc = 1;
  *pmVar6 = 1;
  local_48._mp_d = pmVar6;
  mpz_add(q,q,&local_48);
  (*gmp_free_func)(pmVar6,8);
LAB_005cff44:
  if ((int)uVar2 < 0) {
    q->_mp_size = -q->_mp_size;
  }
  return;
}

Assistant:

static void
mpz_div_q_2exp (mpz_t q, const mpz_t u, mp_bitcnt_t bit_index,
		enum mpz_div_round_mode mode)
{
  mp_size_t un, qn;
  mp_size_t limb_cnt;
  mp_ptr qp;
  int adjust;

  un = u->_mp_size;
  if (un == 0)
    {
      q->_mp_size = 0;
      return;
    }
  limb_cnt = bit_index / GMP_LIMB_BITS;
  qn = GMP_ABS (un) - limb_cnt;
  bit_index %= GMP_LIMB_BITS;

  if (mode == ((un > 0) ? GMP_DIV_CEIL : GMP_DIV_FLOOR)) /* un != 0 here. */
    /* Note: Below, the final indexing at limb_cnt is valid because at
       that point we have qn > 0. */
    adjust = (qn <= 0
	      || !mpn_zero_p (u->_mp_d, limb_cnt)
	      || (u->_mp_d[limb_cnt]
		  & (((mp_limb_t) 1 << bit_index) - 1)));
  else
    adjust = 0;

  if (qn <= 0)
    qn = 0;
  else
    {
      qp = MPZ_REALLOC (q, qn);

      if (bit_index != 0)
	{
	  mpn_rshift (qp, u->_mp_d + limb_cnt, qn, bit_index);
	  qn -= qp[qn - 1] == 0;
	}
      else
	{
	  mpn_copyi (qp, u->_mp_d + limb_cnt, qn);
	}
    }

  q->_mp_size = qn;

  if (adjust)
    mpz_add_ui (q, q, 1);
  if (un < 0)
    mpz_neg (q, q);
}